

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

Vec_Int_t * Gia_ManDfsRequireds(Gia_Man_t *p,Vec_Int_t *vObjs,int ReqTime)

{
  uint uVar1;
  int iVar2;
  Tim_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  undefined8 uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  int *__s;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  uVar1 = p->nObjs;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = uVar9;
  if (uVar9 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar11->pArray = __s;
  pVVar11->nSize = uVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)(int)uVar1 << 2);
  }
  if ((int)uVar1 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *__s = 0;
  pVVar12 = p->vCos;
  iVar10 = pVVar12->nSize;
  if (p_00 == (Tim_Man_t *)0x0) {
    if (0 < iVar10) {
      piVar4 = pVVar12->pArray;
      lVar18 = 0;
      do {
        iVar10 = piVar4[lVar18];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0021b0d7;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar9 = iVar10 - (*(uint *)(p->pObjs + iVar10) & 0x1fffffff);
        if (uVar1 <= uVar9) goto LAB_0021b0f6;
        if (__s[uVar9] == -1 || ReqTime < __s[uVar9]) {
          __s[uVar9] = ReqTime;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < pVVar12->nSize);
    }
  }
  else {
    iVar8 = Tim_ManPoNum(p_00);
    Tim_ManIncrementTravId(p_00);
    pVVar12 = p->vCos;
    if (0 < pVVar12->nSize) {
      lVar18 = 0;
      do {
        iVar2 = pVVar12->pArray[lVar18];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0021b0d7;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar10 - iVar8 <= lVar18) {
          pGVar6 = p->pObjs + iVar2;
          Tim_ManSetCoRequired(p_00,(int)lVar18,(float)ReqTime);
          pGVar3 = p->pObjs;
          if ((pGVar6 < pGVar3) || (pGVar3 + p->nObjs <= pGVar6)) {
LAB_0021b115:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555 -
                  (*(uint *)pGVar6 & 0x1fffffff);
          if (uVar1 <= uVar9) goto LAB_0021b0f6;
          if (__s[uVar9] == -1 || ReqTime < __s[uVar9]) {
            __s[uVar9] = ReqTime;
          }
        }
        lVar18 = lVar18 + 1;
        pVVar12 = p->vCos;
      } while (lVar18 < pVVar12->nSize);
    }
  }
  lVar18 = (long)vObjs->nSize;
  if (0 < (long)vObjs->nSize) {
    do {
      if (vObjs->nSize < lVar18) goto LAB_0021b0b8;
      uVar9 = vObjs->pArray[lVar18 + -1];
      lVar17 = (long)(int)uVar9;
      if (lVar17 < 0) {
        uVar9 = ~uVar9;
        iVar10 = Tim_ManBoxOutputFirst(p_00,uVar9);
        uVar14 = Tim_ManBoxOutputNum(p_00,uVar9);
        if (0 < (int)uVar14) {
          lVar17 = (long)iVar10;
          uVar13 = (ulong)uVar14;
          do {
            if ((iVar10 < 0) || (p->vCis->nSize <= lVar17)) goto LAB_0021b0b8;
            iVar8 = p->vCis->pArray[lVar17];
            lVar15 = (long)iVar8;
            if ((lVar15 < 0) || (p->nObjs <= iVar8)) goto LAB_0021b0d7;
            if ((int)uVar1 <= iVar8) goto LAB_0021b0b8;
            iVar8 = __s[lVar15];
            if (__s[lVar15] == -1) {
              iVar8 = ReqTime;
            }
            if (iVar8 < 0) {
              __assert_fail("Req >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                            ,0x440,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
            }
            if (-1 < (int)*(undefined8 *)(p->pObjs + lVar15)) goto LAB_0021b134;
            Tim_ManSetCiRequired
                      (p_00,(uint)((ulong)*(undefined8 *)(p->pObjs + lVar15) >> 0x20) & 0x1fffffff,
                       (float)iVar8);
            lVar17 = lVar17 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        iVar10 = Tim_ManBoxInputFirst(p_00,uVar9);
        uVar9 = Tim_ManBoxInputNum(p_00,uVar9);
        if (0 < (int)uVar9) {
          lVar17 = (long)iVar10;
          uVar13 = (ulong)uVar9;
          do {
            if ((iVar10 < 0) || (p->vCos->nSize <= lVar17)) goto LAB_0021b0b8;
            iVar8 = p->vCos->pArray[lVar17];
            lVar15 = (long)iVar8;
            if ((lVar15 < 0) || (p->nObjs <= iVar8)) goto LAB_0021b0d7;
            pGVar6 = p->pObjs;
            uVar5 = *(undefined8 *)(pGVar6 + lVar15);
            if (-1 < (int)uVar5) {
LAB_0021b134:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            fVar19 = Tim_ManGetCoRequired(p_00,(uint)((ulong)uVar5 >> 0x20) & 0x1fffffff);
            iVar8 = (int)fVar19;
            if (iVar8 < 0) {
              __assert_fail("Req >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                            ,0x44a,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
            }
            pGVar6 = pGVar6 + lVar15;
            pGVar3 = p->pObjs;
            if ((pGVar6 < pGVar3) || (pGVar3 + p->nObjs <= pGVar6)) goto LAB_0021b115;
            uVar9 = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555 -
                    (*(uint *)pGVar6 & 0x1fffffff);
            if (uVar1 <= uVar9) goto LAB_0021b0f6;
            if ((__s[uVar9] == -1) || (iVar8 < __s[uVar9])) {
              __s[uVar9] = iVar8;
            }
            lVar17 = lVar17 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      else {
        if (uVar9 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x45f,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        if ((int)uVar1 <= (int)uVar9) goto LAB_0021b0b8;
        if (__s[lVar17] < 10) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x451,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar10 = __s[lVar17] + -10;
        pVVar12 = p->vMapping;
        if (pVVar12 == (Vec_Int_t *)0x0) {
          if (p->nObjs <= (int)uVar9) {
LAB_0021b0d7:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar6 = p->pObjs;
          uVar14 = uVar9 - (*(uint *)(pGVar6 + lVar17) & 0x1fffffff);
          if (uVar1 <= uVar14) {
LAB_0021b0f6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if ((__s[uVar14] == -1) || (iVar10 < __s[uVar14])) {
            __s[uVar14] = iVar10;
          }
          uVar9 = uVar9 - (*(uint *)&pGVar6[lVar17].field_0x4 & 0x1fffffff);
          if (uVar1 <= uVar9) goto LAB_0021b0f6;
          if ((__s[uVar9] == -1) || (iVar10 < __s[uVar9])) {
            __s[uVar9] = iVar10;
          }
        }
        else {
          if (pVVar12->nSize <= (int)uVar9) {
LAB_0021b0b8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar4 = pVVar12->pArray;
          if (piVar4[lVar17] == 0) {
            __assert_fail("Gia_ObjIsLut(p, Entry)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                          ,0x454,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
          }
          iVar8 = pVVar12->nSize;
          if (iVar8 <= (int)uVar9) goto LAB_0021b0b8;
          lVar15 = 0;
          while( true ) {
            lVar16 = (long)piVar4[lVar17];
            if ((lVar16 < 0) || (iVar8 <= piVar4[lVar17])) goto LAB_0021b0b8;
            if (piVar4[lVar16] <= lVar15) break;
            uVar14 = piVar4[lVar16 + lVar15 + 1];
            if (uVar1 <= uVar14) goto LAB_0021b0f6;
            if ((__s[uVar14] == -1) || (iVar10 < __s[uVar14])) {
              __s[uVar14] = iVar10;
            }
            lVar15 = lVar15 + 1;
            iVar8 = pVVar12->nSize;
            if (iVar8 <= (int)uVar9) goto LAB_0021b0b8;
          }
        }
      }
      bVar7 = 1 < lVar18;
      lVar18 = lVar18 + -1;
    } while (bVar7);
  }
  return pVVar11;
}

Assistant:

Vec_Int_t * Gia_ManDfsRequireds( Gia_Man_t * p, Vec_Int_t * vObjs, int ReqTime )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vTimes = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; 
    int j, Entry, k, iFan, Req;
    Vec_IntWriteEntry( vTimes, 0, 0 );
    if ( pManTime ) 
    {
        int nCoLimit = Gia_ManCoNum(p) - Tim_ManPoNum(pManTime);
        Tim_ManIncrementTravId( pManTime );
        //Tim_ManInitPoRequiredAll( pManTime, (float)ReqTime );
        Gia_ManForEachCo( p, pObj, j )
            if ( j >= nCoLimit )
            {
                Tim_ManSetCoRequired( pManTime, j, ReqTime );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
            }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, j )
            Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
    }
    Vec_IntForEachEntryReverse( vObjs, Entry, j )
    {
        if ( Entry < 0 ) // box
        {
            int iFirst, nTerms, iBox = -Entry-1;
            assert( iBox >= 0 );
            // set requireds for box outputs
            iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCi( p, iFirst + k );
                Req  = Vec_IntEntry( vTimes, Gia_ObjId(p, pObj) );
                Req  = Req == -1 ? ReqTime : Req; // dangling box output
                assert( Req >= 0 );
                Tim_ManSetCiRequired( pManTime, Gia_ObjCioId(pObj), Req );
            }
            // derive requireds for box inputs
            iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCo( p, iFirst + k );
                Req  = Tim_ManGetCoRequired( pManTime, Gia_ObjCioId(pObj) );
                assert( Req >= 0 );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), Req );
            }
        }
        else if ( Entry > 0 ) // node
        {
            Req = Vec_IntEntry(vTimes, Entry) - 10;
            assert( Req >= 0 );
            if ( Gia_ManHasMapping(p) )
            {
                assert( Gia_ObjIsLut(p, Entry) );
                Gia_LutForEachFanin( p, Entry, iFan, k )
                    Gia_ManDfsUpdateRequired( vTimes, iFan, Req );
            }
            else
            {
                pObj  = Gia_ManObj( p, Entry );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0(pObj, Entry), Req );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId1(pObj, Entry), Req );
            }
        }
        else assert( 0 );
    }
    return vTimes;
}